

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::addRows
          (SPxLPBase<double> *this,SPxRowId *id,LPRowSetBase<double> *set,bool scale)

{
  int iVar1;
  DataKey DVar2;
  byte in_CL;
  undefined8 in_RDX;
  long in_RSI;
  SPxLPBase<double> *in_RDI;
  int j;
  int i;
  int n;
  int local_24;
  int local_20;
  
  local_20 = nRows((SPxLPBase<double> *)0x23a1aa);
  (*(in_RDI->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[8])(in_RDI,in_RDX,in_CL & 1);
  local_24 = 0;
  while( true ) {
    n = local_20;
    iVar1 = nRows((SPxLPBase<double> *)0x23a1e2);
    if (iVar1 <= n) break;
    DVar2 = (DataKey)rId(in_RDI,n);
    *(DataKey *)(in_RSI + (long)local_24 * 8) = DVar2;
    local_20 = local_20 + 1;
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

virtual void addRows(SPxRowId id[], const LPRowSetBase<R>& set, bool scale = false)
   {
      int i = nRows();
      addRows(set, scale);

      for(int j = 0; i < nRows(); ++i, ++j)
         id[j] = rId(i);
   }